

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Skeleton_blocker_complex.h
# Opt level: O1

optional<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_> * __thiscall
Gudhi::skeleton_blocker::
Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::operator[]
          (optional<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>
           *__return_storage_ptr__,
          Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits> *this,
          pair<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
          *ab)

{
  pointer psVar1;
  _Base_ptr p_Var2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  _Rb_tree_header *p_Var6;
  optional<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_> *res;
  _Base_ptr p_Var7;
  _Rb_tree_header *p_Var8;
  
  (__return_storage_ptr__->super_type).m_initialized = false;
  lVar4 = (long)(ab->first).vertex;
  uVar5 = (ulong)(ab->second).vertex;
  psVar1 = (this->skeleton).super_type.m_vertices.
           super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>,_boost::vecS,_boost::setS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>,_boost::vecS,_boost::setS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>::config::stored_vertex>_>
           ._M_impl.super__Vector_impl_data._M_start;
  p_Var6 = (_Rb_tree_header *)((long)&psVar1[lVar4].super_StoredVertex.m_out_edges._M_t + 8);
  p_Var7 = (_Base_ptr)p_Var6;
  for (p_Var2 = *(_Base_ptr *)((long)&psVar1[lVar4].super_StoredVertex.m_out_edges._M_t + 0x10);
      (_Rb_tree_header *)p_Var2 != (_Rb_tree_header *)0x0;
      p_Var2 = (&p_Var2->_M_left)[*(ulong *)(p_Var2 + 1) < uVar5]) {
    if (*(ulong *)(p_Var2 + 1) >= uVar5) {
      p_Var7 = p_Var2;
    }
  }
  p_Var8 = p_Var6;
  if (((_Rb_tree_header *)p_Var7 != p_Var6) &&
     (p_Var8 = (_Rb_tree_header *)p_Var7, uVar5 < ((_Rb_tree_header *)p_Var7)->_M_node_count)) {
    p_Var8 = p_Var6;
  }
  if (p_Var8 != p_Var6) {
    lVar3 = *(long *)(p_Var8 + 1);
    *(long *)&(__return_storage_ptr__->super_type).m_storage.dummy_ = lVar4;
    *(ulong *)((long)&(__return_storage_ptr__->super_type).m_storage.dummy_ + 8) = uVar5;
    *(long *)((long)&(__return_storage_ptr__->super_type).m_storage.dummy_ + 0x10) = lVar3 + 0x20;
    (__return_storage_ptr__->super_type).m_initialized = true;
  }
  return __return_storage_ptr__;
}

Assistant:

boost::optional<Edge_handle> operator[](
                                          const std::pair<Vertex_handle, Vertex_handle>& ab) const {
    boost::optional<Edge_handle> res;
    std::pair<Edge_handle, bool> edge_pair(
                                           boost::edge(ab.first.vertex, ab.second.vertex, skeleton));
    if (edge_pair.second)
      res = edge_pair.first;
    return res;
  }